

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ImportModuleVariables(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  uint uVar1;
  uint uniqueId;
  VariableData **ppVVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ExternVarInfo *pEVar6;
  size_t sVar7;
  TypeBase *type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VariableData *pVVar8;
  ByteCode *code;
  ulong uVar9;
  InplaceStr name;
  VariableData *data;
  char *local_68;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *local_60;
  ByteCode *local_58;
  InplaceStr local_50;
  TraceScope traceScope;
  SynIdentifier *name_00;
  
  if ((ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar4 != 0)) {
    ImportModuleVariables::token = NULLC::TraceGetToken("analyze","ImportModuleVariables");
    __cxa_guard_release(&ImportModuleVariables(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleVariables::token);
  code = moduleCtx->data->bytecode;
  pcVar5 = FindSymbols(code);
  pEVar6 = FindFirstVar(code);
  if (code->variableExportCount != 0) {
    local_60 = &ctx->vtableMap;
    uVar9 = 0;
    local_58 = code;
    do {
      pVVar8 = (VariableData *)(pcVar5 + pEVar6->offsetToName);
      name.begin = (char *)pVVar8;
      sVar7 = strlen((char *)pVVar8);
      name.end = (char *)((long)(pVVar8->users).little + (sVar7 - 0x58));
      if ((uint)sVar7 < 5) {
LAB_001710bc:
        type = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar6->type);
        if (type == (TypeBase *)0x0) {
          anon_unknown.dwarf_9c70f::Stop
                    (ctx,source,"ERROR: can\'t find variable \'%s\' type in module %.*s",
                     pcVar5 + pEVar6->offsetToName,
                     (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                  (int)(moduleCtx->data->name).begin));
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_00 = (SynIdentifier *)CONCAT44(extraout_var,iVar4);
        (name_00->super_SynBase).typeID = 4;
        (name_00->super_SynBase).begin = (Lexeme *)0x0;
        (name_00->super_SynBase).end = (Lexeme *)0x0;
        (name_00->super_SynBase).pos.begin = (char *)0x0;
        (name_00->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(name_00->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(name_00->super_SynBase).next + 2) = 0;
        (name_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
        *(undefined4 *)&(name_00->name).begin = name.begin._0_4_;
        *(undefined4 *)((long)&(name_00->name).begin + 4) = name.begin._4_4_;
        *(int *)&(name_00->name).end = (int)name.end;
        *(undefined4 *)((long)&(name_00->name).end + 4) = name.end._4_4_;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar8 = (VariableData *)CONCAT44(extraout_var_00,iVar4);
        uVar1 = pEVar6->offset;
        uniqueId = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uniqueId + 1;
        VariableData::VariableData
                  (pVVar8,ctx->allocator,source,ctx->scope,0,type,name_00,uVar1,uniqueId);
        pVVar8->importModule = moduleCtx->data;
        data = pVVar8;
        ExpressionContext::AddVariable(ctx,pVVar8,true);
        code = local_58;
        if ((5 < (uint)((int)name.end - (int)name.begin)) &&
           (name.begin[4] == 'l' && *(int *)name.begin == 0x62747624)) {
          uVar1 = (ctx->vtables).count;
          if (uVar1 == (ctx->vtables).max) {
            SmallArray<VariableData_*,_128U>::grow(&ctx->vtables,uVar1);
          }
          ppVVar2 = (ctx->vtables).data;
          if (ppVVar2 == (VariableData **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]"
                         );
          }
          uVar1 = (ctx->vtables).count;
          (ctx->vtables).count = uVar1 + 1;
          ppVVar2[uVar1] = data;
          SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                    (local_60,&name,&data);
          code = local_58;
        }
      }
      else {
        local_68 = (char *)((long)&pVVar8->source + 5);
        local_50.begin = "$temp";
        local_50.end = "";
        data = pVVar8;
        bVar3 = InplaceStr::operator==((InplaceStr *)&data,&local_50);
        if (!bVar3) goto LAB_001710bc;
      }
      uVar9 = uVar9 + 1;
      pEVar6 = pEVar6 + 1;
    } while (uVar9 < code->variableExportCount);
  }
  NULLC::TraceScope::~TraceScope(&traceScope);
  return;
}

Assistant:

void ImportModuleVariables(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleVariables");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import variables
	ExternVarInfo *variableList = FindFirstVar(bCode);

	for(unsigned i = 0; i < bCode->variableExportCount; i++)
	{
		ExternVarInfo &variable = variableList[i];

		InplaceStr name = InplaceStr(symbols + variable.offsetToName);

		// Exclude temporary variables from import
		if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
			continue;

		TypeBase *type = GetImportedModuleTypeAt(ctx, source, moduleCtx, variable.type);

		if(!type)
			Stop(ctx, source, "ERROR: can't find variable '%s' type in module %.*s", symbols + variable.offsetToName, FMT_ISTR(moduleCtx.data->name));

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

		VariableData *data = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, nameIdentifier, variable.offset, ctx.uniqueVariableId++);

		data->importModule = moduleCtx.data;

		ctx.AddVariable(data, true);

		if(name.length() > 5 && memcmp(name.begin, "$vtbl", 5) == 0)
		{
			ctx.vtables.push_back(data);
			ctx.vtableMap.insert(name, data);
		}
	}
}